

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  anon_union_8_5_44880d43_for_u aVar4;
  
  pVal = *argv;
  bVar3 = pVal->type;
  if (1 < bVar3 - 1) {
    if (bVar3 == 3) {
      pbVar2 = (byte *)sqlite3ValueText(pVal,'\x01');
      if (pbVar2 == (byte *)0x0) {
        return;
      }
      bVar3 = *pbVar2;
      aVar4.i = 0;
      if (bVar3 != 0) {
        do {
          if (bVar3 < 0xc0) {
            bVar3 = pbVar2[1];
          }
          else {
            bVar3 = pbVar2[1];
          }
          pbVar2 = pbVar2 + 1;
          aVar4.nZero = aVar4.nZero + 1;
          aVar4.i._4_4_ = 0;
        } while (bVar3 != 0);
        aVar4.i._4_4_ = 0;
      }
      goto LAB_0017496a;
    }
    if (bVar3 != 4) {
      sqlite3VdbeMemSetNull(&context->s);
      return;
    }
  }
  iVar1 = sqlite3ValueBytes(pVal,'\x01');
  aVar4 = (anon_union_8_5_44880d43_for_u)(long)iVar1;
LAB_0017496a:
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u = aVar4;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int len;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      if( z==0 ) return;
      len = 0;
      while( *z ){
        len++;
        SQLITE_SKIP_UTF8(z);
      }
      sqlite3_result_int(context, len);
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}